

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O0

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::cmBasicUVStreambuf
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this,size_t bufSize,size_t putBack)

{
  unsigned_long *puVar1;
  size_type __n;
  int __fd;
  allocator_type local_35 [13];
  unsigned_long local_28;
  size_t local_20;
  size_t putBack_local;
  size_t bufSize_local;
  cmBasicUVStreambuf<char,_std::char_traits<char>_> *this_local;
  
  local_20 = putBack;
  putBack_local = bufSize;
  bufSize_local = (size_t)this;
  std::streambuf::streambuf((streambuf *)this);
  *(undefined ***)this = &PTR__cmBasicUVStreambuf_017d0430;
  this->Stream = (uv_stream_t *)0x0;
  this->OldStreamData = (void *)0x0;
  local_28 = 1;
  puVar1 = std::max<unsigned_long>(&local_20,&local_28);
  this->PutBack = *puVar1;
  puVar1 = std::max<unsigned_long>(&this->PutBack,&putBack_local);
  __n = *puVar1 + this->PutBack;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&this->InputBuffer,__n,local_35);
  __fd = (int)__n;
  std::allocator<char>::~allocator(local_35);
  this->EndOfFile = false;
  close(this,__fd);
  return;
}

Assistant:

cmBasicUVStreambuf<CharT, Traits>::cmBasicUVStreambuf(std::size_t bufSize,
                                                      std::size_t putBack)
  : PutBack(std::max<std::size_t>(putBack, 1))
  , InputBuffer(std::max<std::size_t>(this->PutBack, bufSize) + this->PutBack)
{
  this->close();
}